

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfo *
embree::sse2::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  Geometry *pGVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  task *ptVar6;
  runtime_error *prVar7;
  ulong uVar8;
  ulong uVar9;
  size_t *psVar10;
  long lVar11;
  size_t *psVar12;
  ulong uVar13;
  size_t sVar14;
  _func_int **pp_Var15;
  long lVar16;
  unsigned_long end;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  size_t sVar28;
  size_t taskCount;
  small_object_allocator alloc;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_2dc9;
  _func_int **local_2dc8;
  long **local_2dc0;
  task_traits local_2db8;
  Scene *local_2db0;
  GTypeMask local_2da8;
  char local_2da0;
  mvector<PrimRef> *local_2d98;
  mvector<PrimRef> *local_2d90;
  Scene **local_2d88;
  size_t local_2d80;
  mvector<PrimRef> **local_2d78;
  Scene **local_2d70;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  size_t local_2d28;
  size_t sStack_2d20;
  long *local_2d18;
  _func_int ***local_2d10;
  undefined8 *local_2d08;
  Scene ***local_2d00;
  undefined1 *local_2cf8;
  mvector<PrimRef> ***local_2cf0;
  undefined8 local_2ce8;
  undefined4 local_2ce0;
  wait_context local_2cd8;
  task_group_context local_2cc8;
  long local_2c48 [64];
  ulong local_2a48 [64];
  _func_int **local_2848;
  ulong local_2840;
  size_t local_13f8 [633];
  
  local_2848 = (_func_int **)0x0;
  uVar17 = 0;
  local_2db0 = scene;
  local_2da8 = types;
  local_2da0 = mblur;
  local_2d98 = prims;
  local_2d80 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar28 = (local_2db0->geometries).size_active;
  if (sVar28 != 0) {
    uVar17 = 0;
    sVar14 = 0;
    do {
      pGVar1 = (local_2db0->geometries).items[sVar14].ptr;
      if ((((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
          ((local_2da8 & 1 << (SUB41(pGVar1->field_8,0) & 0x1f)) == ~MTY_ALL)) ||
         ((bool)local_2da0 != (pGVar1->numTimeSteps != 1))) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)pGVar1->numPrimitives;
      }
      uVar17 = uVar17 + uVar8;
      sVar14 = sVar14 + 1;
    } while (sVar28 != sVar14);
  }
  local_2840 = uVar17;
  iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar8 = uVar17 + 0x3ff >> 10;
  if ((ulong)(long)iVar4 < uVar8) {
    uVar8 = (long)iVar4;
  }
  uVar13 = 0x40;
  if (uVar8 < 0x40) {
    uVar13 = uVar8;
  }
  local_2848 = (_func_int **)(uVar13 + (uVar13 == 0));
  local_2c48[0] = 0;
  local_2a48[0] = 0;
  if (1 < uVar8) {
    uVar13 = 0;
    uVar8 = uVar17 / (ulong)local_2848;
    pp_Var15 = (_func_int **)0x1;
    lVar16 = 0;
    do {
      pGVar1 = (local_2db0->geometries).items[lVar16].ptr;
      if (((pGVar1 == (Geometry *)0x0) || (((uint)pGVar1->field_8 >> 0x15 & 1) == 0)) ||
         (((local_2da8 & 1 << (SUB41(pGVar1->field_8,0) & 0x1f)) == ~MTY_ALL ||
          ((bool)local_2da0 != (pGVar1->numTimeSteps != 1))))) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)pGVar1->numPrimitives;
      }
      if (uVar18 == 0) {
        lVar11 = 0;
      }
      else {
        uVar9 = ((long)pp_Var15 + 1) * uVar17;
        lVar11 = 0;
        uVar19 = 0;
        do {
          uVar5 = uVar8;
          uVar8 = uVar5;
          if ((uVar13 + uVar18 + lVar11 < uVar5) || (local_2848 <= pp_Var15)) break;
          local_2c48[(long)pp_Var15] = lVar16;
          uVar19 = uVar19 + (uVar5 - uVar13);
          local_2a48[(long)pp_Var15] = uVar19;
          pp_Var15 = (_func_int **)((long)pp_Var15 + 1);
          uVar8 = uVar9 / (ulong)local_2848;
          lVar11 = -uVar19;
          uVar9 = uVar9 + uVar17;
          uVar13 = uVar5;
        } while (uVar19 < uVar18);
      }
      uVar13 = uVar13 + uVar18 + lVar11;
      lVar16 = lVar16 + 1;
    } while (pp_Var15 < local_2848);
  }
  pp_Var15 = local_2848;
  local_2d68 = 0x7f8000007f800000;
  uStack_2d60 = 0x7f8000007f800000;
  local_2d58 = 0xff800000ff800000;
  uStack_2d50 = 0xff800000ff800000;
  local_2d48 = 0x7f8000007f800000;
  uStack_2d40 = 0x7f8000007f800000;
  local_2d38 = 0xff800000ff800000;
  uStack_2d30 = 0xff800000ff800000;
  local_2d28 = 0;
  sStack_2d20 = 0;
  local_2d78 = &local_2d90;
  local_2d90 = local_2d98;
  local_2d88 = &local_2db0;
  local_2d00 = &local_2d88;
  local_2d10 = &local_2dc8;
  local_2d18 = local_2c48;
  local_2cf8 = &local_2dc9;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2dc8 = local_2848;
  local_2d70 = local_2d88;
  local_2d08 = &local_2d68;
  local_2cf0 = &local_2d78;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2dc0 = &local_2d18;
  if (pp_Var15 != (_func_int **)0x0) {
    local_2db8.m_version_and_traits = 0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2db8,0xc0);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_02206e58;
    ptVar6[1]._vptr_task = pp_Var15;
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 1;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_2dc0;
    ptVar6[1].m_reserved[2] = 0;
    ptVar6[1].m_reserved[3] = 1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar6[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
    ptVar6[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
    ptVar6[2].super_task_traits.m_version_and_traits = local_2db8.m_version_and_traits;
    local_2ce8 = 0;
    local_2ce0 = 1;
    local_2cd8.m_version_and_traits = 1;
    local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar6[1].m_reserved[4] = (uint64_t)&local_2ce8;
    tbb::detail::r1::execute_and_wait(ptVar6,&local_2cc8,&local_2cd8,&local_2cc8);
  }
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar3 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  aVar20._8_8_ = uStack_2d60;
  aVar20._0_8_ = local_2d68;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  aVar22._8_8_ = uStack_2d50;
  aVar22._0_8_ = local_2d58;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar22;
  aVar24._8_8_ = uStack_2d40;
  aVar24._0_8_ = local_2d48;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  aVar26._8_8_ = uStack_2d30;
  aVar26._0_8_ = local_2d38;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar26;
  __return_storage_ptr__->begin = local_2d28;
  __return_storage_ptr__->end = sStack_2d20;
  if (local_2dc8 != (_func_int **)0x0) {
    psVar10 = &__return_storage_ptr__->begin;
    sVar28 = *psVar10;
    sVar14 = __return_storage_ptr__->end;
    psVar12 = local_13f8;
    pp_Var15 = local_2dc8;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar12 + -8) = aVar20;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar12 + -6) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar12 + -4) = aVar24;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar12 + -2) = aVar26;
      sVar2 = __return_storage_ptr__->end;
      *psVar12 = *psVar10;
      psVar12[1] = sVar2;
      aVar20.m128 = (__m128)minps(aVar20.m128,*(undefined1 (*) [16])(psVar12 + -0x288));
      aVar22.m128 = (__m128)maxps(aVar22.m128,*(undefined1 (*) [16])(psVar12 + -0x286));
      aVar24.m128 = (__m128)minps(aVar24.m128,*(undefined1 (*) [16])(psVar12 + -0x284));
      aVar26.m128 = (__m128)maxps(aVar26.m128,*(undefined1 (*) [16])(psVar12 + -0x282));
      sVar28 = sVar28 + psVar12[-0x280];
      sVar14 = sVar14 + psVar12[-0x27f];
      *psVar10 = sVar28;
      __return_storage_ptr__->end = sVar14;
      psVar12 = psVar12 + 10;
      pp_Var15 = (_func_int **)((long)pp_Var15 + -1);
    } while (pp_Var15 != (_func_int **)0x0);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar26;
  if (__return_storage_ptr__->end - __return_storage_ptr__->begin != local_2d80) {
    (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
    pp_Var15 = local_2848;
    local_2d68 = 0x7f8000007f800000;
    uStack_2d60 = 0x7f8000007f800000;
    local_2d58 = 0xff800000ff800000;
    uStack_2d50 = 0xff800000ff800000;
    local_2d48 = 0x7f8000007f800000;
    uStack_2d40 = 0x7f8000007f800000;
    local_2d38 = 0xff800000ff800000;
    uStack_2d30 = 0xff800000ff800000;
    local_2d28 = 0;
    sStack_2d20 = 0;
    local_2d90 = local_2d98;
    local_2d88 = &local_2db0;
    local_2d78 = &local_2d90;
    local_2dc8 = local_2848;
    local_2d18 = local_2c48;
    local_2d10 = &local_2dc8;
    local_2cf8 = &local_2dc9;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2d70 = local_2d88;
    local_2d08 = &local_2d68;
    local_2d00 = &local_2d88;
    local_2cf0 = &local_2d78;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2dc0 = &local_2d18;
    if (pp_Var15 != (_func_int **)0x0) {
      local_2db8.m_version_and_traits = 0;
      ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2db8,0xc0);
      ptVar6->m_reserved[3] = 0;
      ptVar6->m_reserved[4] = 0;
      ptVar6->m_reserved[1] = 0;
      ptVar6->m_reserved[2] = 0;
      (ptVar6->super_task_traits).m_version_and_traits = 0;
      ptVar6->m_reserved[0] = 0;
      ptVar6->m_reserved[5] = 0;
      ptVar6->_vptr_task = (_func_int **)&PTR__task_02206ea0;
      ptVar6[1]._vptr_task = pp_Var15;
      ptVar6[1].super_task_traits.m_version_and_traits = 0;
      ptVar6[1].m_reserved[0] = 1;
      ptVar6[1].m_reserved[1] = (uint64_t)&local_2dc0;
      ptVar6[1].m_reserved[2] = 0;
      ptVar6[1].m_reserved[3] = 1;
      iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar6[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
      ptVar6[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
      ptVar6[2].super_task_traits.m_version_and_traits = local_2db8.m_version_and_traits;
      local_2ce8 = 0;
      local_2ce0 = 1;
      local_2cd8.m_version_and_traits = 1;
      local_2cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar6[1].m_reserved[4] = (uint64_t)&local_2ce8;
      tbb::detail::r1::execute_and_wait(ptVar6,&local_2cc8,&local_2cd8,&local_2cc8);
    }
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    aVar27._8_8_ = uStack_2d60;
    aVar27._0_8_ = local_2d68;
    aVar25._8_8_ = uStack_2d50;
    aVar25._0_8_ = local_2d58;
    aVar23._8_8_ = uStack_2d40;
    aVar23._0_8_ = local_2d48;
    aVar21._8_8_ = uStack_2d30;
    aVar21._0_8_ = local_2d38;
    if (local_2dc8 != (_func_int **)0x0) {
      psVar10 = local_13f8;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -8) = aVar27;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -6) = aVar25;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -4) = aVar23;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -2) = aVar21;
        *psVar10 = local_2d28;
        psVar10[1] = sStack_2d20;
        aVar27.m128 = (__m128)minps(aVar27.m128,*(undefined1 (*) [16])(psVar10 + -0x288));
        aVar25.m128 = (__m128)maxps(aVar25.m128,*(undefined1 (*) [16])(psVar10 + -0x286));
        aVar23.m128 = (__m128)minps(aVar23.m128,*(undefined1 (*) [16])(psVar10 + -0x284));
        aVar21.m128 = (__m128)maxps(aVar21.m128,*(undefined1 (*) [16])(psVar10 + -0x282));
        local_2d28 = local_2d28 + psVar10[-0x280];
        sStack_2d20 = sStack_2d20 + psVar10[-0x27f];
        psVar10 = psVar10 + 10;
        local_2dc8 = (_func_int **)((long)local_2dc8 + -1);
      } while (local_2dc8 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar27;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar25;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar23;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar21;
    __return_storage_ptr__->begin = local_2d28;
    __return_storage_ptr__->end = sStack_2d20;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(Scene* scene, Geometry::GTypeMask types, bool mblur, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
          return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
            return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
          }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }